

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O0

FConfigEntry * __thiscall
FConfigFile::ReadMultiLineValue
          (FConfigFile *this,void *file,FConfigSection *section,char *key,char *endtag)

{
  int iVar1;
  size_t __n;
  undefined4 extraout_var;
  char *value_00;
  FConfigEntry *pFVar2;
  long local_1060;
  size_t i;
  size_t endlen;
  FString value;
  char readbuf [4096];
  char *endtag_local;
  char *key_local;
  FConfigSection *section_local;
  void *file_local;
  FConfigFile *this_local;
  
  FString::FString((FString *)&endlen);
  __n = strlen(endtag);
  while( true ) {
    iVar1 = (*this->_vptr_FConfigFile[3])(this,&value,0x1000,file);
    if (CONCAT44(extraout_var,iVar1) == 0) goto LAB_0057fcc4;
    if (((((char)value.Chars == '>') && (value.Chars._1_1_ == '>')) && (value.Chars._2_1_ == '>'))
       && (iVar1 = strncmp((char *)((long)&value.Chars + 3),endtag,__n), iVar1 == 0)) break;
    FString::operator<<((FString *)&endlen,(char *)&value);
  }
  for (local_1060 = __n + 3;
      (readbuf[local_1060 + -8] != '\0' &&
      ((readbuf[local_1060 + -8] == '\n' || (readbuf[local_1060 + -8] == '\r'))));
      local_1060 = local_1060 + 1) {
  }
  if (readbuf[local_1060 + -8] == '\0') {
    FString::StripRight((FString *)&endlen,"\n\r");
  }
LAB_0057fcc4:
  value_00 = FString::operator_cast_to_char_((FString *)&endlen);
  pFVar2 = NewConfigEntry(this,section,key,value_00);
  FString::~FString((FString *)&endlen);
  return pFVar2;
}

Assistant:

FConfigFile::FConfigEntry *FConfigFile::ReadMultiLineValue(void *file, FConfigSection *section, const char *key, const char *endtag)
{
	char readbuf[READBUFFERSIZE];
	FString value;
	size_t endlen = strlen(endtag);

	// Keep on reading lines until we reach a line that matches >>>endtag
	while (ReadLine(readbuf, READBUFFERSIZE, file) != NULL)
	{
		// Does the start of this line match the endtag?
		if (readbuf[0] == '>' && readbuf[1] == '>' && readbuf[2] == '>' &&
			strncmp(readbuf + 3, endtag, endlen) == 0)
		{ // Is there nothing but line break characters after the match?
			size_t i;
			for (i = endlen + 3; readbuf[i] != '\0'; ++i)
			{
				if (readbuf[i] != '\n' && readbuf[i] != '\r')
				{ // Not a line break character
					break;
				}
			}
			if (readbuf[i] == '\0')
			{ // We're done; strip the previous line's line breaks, since it's not part of the value.
				value.StripRight("\n\r");
			}
			break;
		}
		// Append this line to the value.
		value << readbuf;
	}
	return NewConfigEntry(section, key, value);
}